

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

SeatPromptResult *
term_get_userpass_input(SeatPromptResult *__return_storage_ptr__,Terminal *term,prompts_t *p)

{
  char *pcVar1;
  prompt_t *ppVar2;
  _Bool _Var3;
  ulong *ptr;
  size_t sVar4;
  strbuf *psVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  ptrlen suffix;
  ptrlen suffix_00;
  ptrlen whole;
  ptrlen whole_00;
  LdiscInputToken LVar10;
  char c;
  SeatPromptResultKind local_94;
  char *local_80;
  SeatPromptResult local_78;
  SeatPromptResult local_50;
  
  if (term->ldisc == (Ldisc *)0x0) {
    make_spr_sw_abort_static(&local_50,"Terminal not prepared for interactive prompts");
    local_78.errdata_lit = local_50.errdata_lit;
    local_78.errdata_u = local_50.errdata_u;
    local_78._28_4_ = local_50._28_4_;
    local_78.kind = local_50.kind;
    local_78._4_4_ = local_50._4_4_;
    local_78.errfn = local_50.errfn;
    if (p->callback == (toplevel_callback_fn_t)0x0) goto LAB_0011061e;
    queue_toplevel_callback(p->callback,p->callback_ctx);
    if (term->ldisc != (Ldisc *)0x0) {
      ldisc_enable_prompt_callback(term->ldisc,(prompts_t *)0x0);
    }
    (p->spr).errdata_lit = local_78.errdata_lit;
    (p->spr).errdata_u = local_78.errdata_u;
    *(undefined4 *)&(p->spr).field_0x1c = local_78._28_4_;
    (p->spr).kind = local_78.kind;
    *(undefined4 *)&(p->spr).field_0x4 = local_78._4_4_;
    (p->spr).errfn = local_78.errfn;
  }
  else {
    if ((p->spr).kind == SPRK_INCOMPLETE) {
      ptr = (ulong *)p->data;
      if (ptr == (ulong *)0x0) {
        ptr = (ulong *)safemalloc(1,0x10,0);
        p->data = ptr;
        (p->spr).kind = SPRK_INCOMPLETE;
        (p->spr).errdata_lit = (char *)0x0;
        *ptr = 0;
        *(undefined1 *)(ptr + 1) = 0;
        if ((p->name_reqd == true) && (pcVar1 = p->name, pcVar1 != (char *)0x0)) {
          sVar4 = strlen(pcVar1);
          term_data(term,pcVar1,sVar4);
          suffix.len = 1;
          suffix.ptr = "\n";
          whole.len = sVar4;
          whole.ptr = pcVar1;
          _Var3 = ptrlen_endswith(whole,suffix,(ptrlen *)0x0);
          if (!_Var3) {
            term_data(term,"\r\n",2);
          }
        }
        pcVar1 = p->instruction;
        if (pcVar1 != (char *)0x0) {
          sVar4 = strlen(pcVar1);
          term_data(term,pcVar1,sVar4);
          suffix_00.len = 1;
          suffix_00.ptr = "\n";
          whole_00.len = sVar4;
          whole_00.ptr = pcVar1;
          _Var3 = ptrlen_endswith(whole_00,suffix_00,(ptrlen *)0x0);
          if (!_Var3) {
            term_data(term,"\r\n",2);
          }
        }
        if (0 < (int)p->n_prompts) {
          lVar8 = 0;
          do {
            prompt_set_result(p->prompts[lVar8],"");
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)p->n_prompts);
        }
      }
      local_94 = __return_storage_ptr__->kind;
      local_80 = __return_storage_ptr__->errdata_lit;
      do {
        if (p->n_prompts <= *ptr) goto LAB_0011055f;
        ppVar2 = p->prompts[*ptr];
        if ((char)ptr[1] == '\0') {
          pcVar1 = ppVar2->prompt;
          sVar4 = strlen(pcVar1);
          term_data(term,pcVar1,sVar4);
          *(undefined1 *)(ptr + 1) = 1;
        }
        _Var3 = ldisc_has_input_buffered(term->ldisc);
        if (_Var3) {
          bVar7 = false;
          do {
            _Var3 = ldisc_has_input_buffered(term->ldisc);
            if (!_Var3) break;
            LVar10 = ldisc_get_input_token(term->ldisc);
            if (((undefined1  [12])LVar10 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
              local_78.kind._0_1_ = LVar10.field_1._0_1_;
LAB_00110378:
              if ((byte)(undefined1)local_78.kind < 0x15) {
                switch((undefined1)local_78.kind) {
                case 3:
                case 4:
                  term_data(term,"\r\n",2);
                  safefree(ptr);
                  p->data = (void *)0x0;
                  if (p->callback == (toplevel_callback_fn_t)0x0) {
                    __return_storage_ptr__->errdata_lit = local_80;
                    __return_storage_ptr__->kind = local_94;
                    goto LAB_0011061e;
                  }
                  queue_toplevel_callback(p->callback,p->callback_ctx);
                  if (term->ldisc != (Ldisc *)0x0) {
                    ldisc_enable_prompt_callback(term->ldisc,(prompts_t *)0x0);
                  }
                  (p->spr).kind = SPRK_USER_ABORT;
                  (p->spr).errdata_lit = (char *)0x0;
                  local_94 = SPRK_USER_ABORT;
                  local_80 = (char *)0x0;
                  iVar9 = 1;
                  break;
                default:
switchD_001103a2_caseD_5:
                  if ((ppVar2->echo != true) ||
                     (iVar9 = 0,
                     0x9f < (byte)(undefined1)local_78.kind ||
                     (byte)((undefined1)local_78.kind - 0x20) < 0x5f)) {
                    BinarySink_put_byte(ppVar2->result->binarysink_,(undefined1)local_78.kind);
                    iVar9 = 0;
                    if (ppVar2->echo == true) {
                      term_data(term,&local_78,1);
                    }
                  }
                  break;
                case 8:
switchD_001103a2_caseD_8:
                  iVar9 = 0;
                  if (ppVar2->result->len != 0) {
                    if (ppVar2->echo == true) {
                      term_data(term,"\b \b",3);
                    }
                    strbuf_shrink_by(ppVar2->result,1);
                    iVar9 = 0;
                  }
                  break;
                case 10:
                case 0xd:
                  term_data(term,"\r\n",2);
                  *ptr = *ptr + 1;
                  *(undefined1 *)(ptr + 1) = 0;
                  bVar7 = true;
                  iVar9 = 0;
                }
              }
              else {
                if (((undefined1)local_78.kind != 0x15) && ((undefined1)local_78.kind != 0x1b)) {
                  if ((undefined1)local_78.kind == 0x7f) goto switchD_001103a2_caseD_8;
                  goto switchD_001103a2_caseD_5;
                }
                iVar9 = 0;
                psVar5 = ppVar2->result;
                while (psVar5->len != 0) {
                  if (ppVar2->echo == true) {
                    term_data(term,"\b \b",3);
                  }
                  strbuf_shrink_by(ppVar2->result,1);
                  psVar5 = ppVar2->result;
                }
              }
            }
            else {
              iVar9 = 7;
              iVar6 = LVar10.field_1._0_4_;
              if (10 < iVar6) {
                if (iVar6 == 0xb) goto LAB_00110373;
                if (iVar6 != 0xe) goto LAB_00110491;
                local_78.kind._0_1_ = 0xd;
                goto LAB_00110378;
              }
              if (iVar6 == 1) {
LAB_00110373:
                local_78.kind._0_1_ = 3;
                goto LAB_00110378;
              }
              if (iVar6 == 6) {
                local_78.kind._0_1_ = 8;
                goto LAB_00110378;
              }
            }
LAB_00110491:
            if ((iVar9 != 7) && (iVar9 != 0)) goto LAB_0011054c;
          } while (!bVar7);
          iVar9 = 0;
        }
        else {
          iVar9 = 6;
        }
LAB_0011054c:
      } while (iVar9 == 0);
      if (iVar9 != 6) {
        __return_storage_ptr__->errdata_lit = local_80;
        __return_storage_ptr__->kind = local_94;
        return __return_storage_ptr__;
      }
LAB_0011055f:
      __return_storage_ptr__->errdata_lit = local_80;
      __return_storage_ptr__->kind = local_94;
      if (*ptr < p->n_prompts) {
        ldisc_enable_prompt_callback(term->ldisc,p);
        __return_storage_ptr__->kind = SPRK_INCOMPLETE;
        __return_storage_ptr__->errdata_lit = (char *)0x0;
        return __return_storage_ptr__;
      }
      safefree(ptr);
      p->data = (void *)0x0;
      if (p->callback != (toplevel_callback_fn_t)0x0) {
        queue_toplevel_callback(p->callback,p->callback_ctx);
        if (term->ldisc != (Ldisc *)0x0) {
          ldisc_enable_prompt_callback(term->ldisc,(prompts_t *)0x0);
        }
        (p->spr).kind = SPRK_OK;
        (p->spr).errdata_lit = (char *)0x0;
        __return_storage_ptr__->kind = SPRK_OK;
        __return_storage_ptr__->errdata_lit = (char *)0x0;
        return __return_storage_ptr__;
      }
LAB_0011061e:
      __assert_fail("p->callback && \"Asynchronous userpass input requires a callback\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x1e39,
                    "SeatPromptResult signal_prompts_t(Terminal *, prompts_t *, SeatPromptResult)");
    }
    local_78.kind = (p->spr).kind;
    local_78._4_4_ = *(undefined4 *)&(p->spr).field_0x4;
    local_78.errfn._0_4_ = *(undefined4 *)&(p->spr).errfn;
    local_78.errfn._4_4_ = *(undefined4 *)((long)&(p->spr).errfn + 4);
    local_78.errdata_lit._0_4_ = *(undefined4 *)&(p->spr).errdata_lit;
    local_78.errdata_lit._4_4_ = *(undefined4 *)((long)&(p->spr).errdata_lit + 4);
    local_78.errdata_u = (p->spr).errdata_u;
    local_78._28_4_ = *(undefined4 *)&(p->spr).field_0x1c;
  }
  *(undefined4 *)&__return_storage_ptr__->errdata_lit = local_78.errdata_lit._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->errdata_lit + 4) = local_78.errdata_lit._4_4_;
  __return_storage_ptr__->errdata_u = local_78.errdata_u;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_78._28_4_;
  __return_storage_ptr__->kind = local_78.kind;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_78._4_4_;
  *(undefined4 *)&__return_storage_ptr__->errfn = local_78.errfn._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->errfn + 4) = local_78.errfn._4_4_;
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult term_get_userpass_input(Terminal *term, prompts_t *p)
{
    if (!term->ldisc) {
        /* Can't handle interactive prompts without an ldisc */
        return signal_prompts_t(term, p, SPR_SW_ABORT(
            "Terminal not prepared for interactive prompts"));
    }

    if (p->spr.kind != SPRK_INCOMPLETE) {
        /* We've already finished these prompts, so return the same
         * result again */
        return p->spr;
    }

    struct term_userpass_state *s = (struct term_userpass_state *)p->data;

    if (!s) {
        /*
         * First call. Set some stuff up.
         */
        p->data = s = snew(struct term_userpass_state);
        p->spr = SPR_INCOMPLETE;
        s->curr_prompt = 0;
        s->done_prompt = false;
        /* We only print the `name' caption if we have to... */
        if (p->name_reqd && p->name) {
            ptrlen plname = ptrlen_from_asciz(p->name);
            term_write(term, plname);
            if (!ptrlen_endswith(plname, PTRLEN_LITERAL("\n"), NULL))
                term_write(term, PTRLEN_LITERAL("\r\n"));
        }
        /* ...but we always print any `instruction'. */
        if (p->instruction) {
            ptrlen plinst = ptrlen_from_asciz(p->instruction);
            term_write(term, plinst);
            if (!ptrlen_endswith(plinst, PTRLEN_LITERAL("\n"), NULL))
                term_write(term, PTRLEN_LITERAL("\r\n"));
        }
        /*
         * Zero all the results, in case we abort half-way through.
         */
        {
            int i;
            for (i = 0; i < (int)p->n_prompts; i++)
                prompt_set_result(p->prompts[i], "");
        }
    }

    while (s->curr_prompt < p->n_prompts) {

        prompt_t *pr = p->prompts[s->curr_prompt];
        bool finished_prompt = false;

        if (!s->done_prompt) {
            term_write(term, ptrlen_from_asciz(pr->prompt));
            s->done_prompt = true;
        }

        /* Breaking out here ensures that the prompt is printed even
         * if we're now waiting for user data. */
        if (!ldisc_has_input_buffered(term->ldisc))
            break;

        /* FIXME: should we be using local-line-editing code instead? */
        while (!finished_prompt && ldisc_has_input_buffered(term->ldisc)) {
            LdiscInputToken tok = ldisc_get_input_token(term->ldisc);

            char c;
            if (tok.is_special) {
                switch (tok.code) {
                  case SS_EOL: c = 13; break;
                  case SS_EC: c = 8; break;
                  case SS_IP: c = 3; break;
                  case SS_EOF: c = 3; break;
                  default: continue;
                }
            } else {
                c = tok.chr;
            }

            switch (c) {
              case 10:
              case 13:
                term_write(term, PTRLEN_LITERAL("\r\n"));
                /* go to next prompt, if any */
                s->curr_prompt++;
                s->done_prompt = false;
                finished_prompt = true; /* break out */
                break;
              case 8:
              case 127:
                if (pr->result->len > 0) {
                    if (pr->echo)
                        term_write(term, PTRLEN_LITERAL("\b \b"));
                    strbuf_shrink_by(pr->result, 1);
                }
                break;
              case 21:
              case 27:
                while (pr->result->len > 0) {
                    if (pr->echo)
                        term_write(term, PTRLEN_LITERAL("\b \b"));
                    strbuf_shrink_by(pr->result, 1);
                }
                break;
              case 3:
              case 4:
                /* Immediate abort. */
                term_write(term, PTRLEN_LITERAL("\r\n"));
                sfree(s);
                p->data = NULL;
                return signal_prompts_t(term, p, SPR_USER_ABORT);
              default:
                /*
                 * This simplistic check for printability is disabled
                 * when we're doing password input, because some people
                 * have control characters in their passwords.
                 */
                if (!pr->echo || (c >= ' ' && c <= '~') ||
                     ((unsigned char) c >= 160)) {
                    put_byte(pr->result, c);
                    if (pr->echo)
                        term_write(term, make_ptrlen(&c, 1));
                }
                break;
            }
        }

    }

    if (s->curr_prompt < p->n_prompts) {
        ldisc_enable_prompt_callback(term->ldisc, p);
        return SPR_INCOMPLETE;
    } else {
        sfree(s);
        p->data = NULL;
        return signal_prompts_t(term, p, SPR_OK);
    }
}